

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OpenDDLExport.cpp
# Opt level: O1

bool __thiscall
ODDLParser::OpenDDLExport::writeValueArray(OpenDDLExport *this,DataArrayList *al,string *statement)

{
  DataArrayList *pDVar1;
  DataArrayList *pDVar2;
  Value *val;
  string *this_00;
  long lVar3;
  bool bVar4;
  
  if (al != (DataArrayList *)0x0) {
    pDVar2 = al;
    pDVar1 = (DataArrayList *)al->m_numItems;
    while (pDVar1 != (DataArrayList *)0x0) {
      this_00 = statement;
      std::__cxx11::string::append((char *)statement);
      val = pDVar2->m_dataList;
      if (val != (Value *)0x0) {
        lVar3 = 0;
        do {
          bVar4 = lVar3 != 0;
          lVar3 = lVar3 + -1;
          if (bVar4) {
            this_00 = statement;
            std::__cxx11::string::append((char *)statement);
          }
          writeValue((OpenDDLExport *)this_00,val,statement);
          val = val->m_next;
        } while (val != (Value *)0x0);
      }
      std::__cxx11::string::append((char *)statement);
      pDVar2 = pDVar2->m_next;
      pDVar1 = pDVar2;
    }
  }
  return al != (DataArrayList *)0x0;
}

Assistant:

bool OpenDDLExport::writeValueArray( DataArrayList *al, std::string &statement ) {
    if (ddl_nullptr == al) {
        return false;
    }

    if (0 == al->m_numItems) {
        return true;
    }

    DataArrayList *nextDataArrayList = al ;
    while (ddl_nullptr != nextDataArrayList) {
        if (ddl_nullptr != nextDataArrayList) {
            statement += "{ ";
            Value *nextValue( nextDataArrayList->m_dataList );
            size_t idx( 0 );
            while (ddl_nullptr != nextValue) {
                if (idx > 0) {
                    statement += ", ";
                }
                writeValue( nextValue, statement );
                nextValue = nextValue->m_next;
                idx++;
            }
            statement += " }";
        }
        nextDataArrayList = nextDataArrayList->m_next;
    }

    return true;
}